

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void __thiscall rw::StreamMemory::seek(StreamMemory *this,int32 offset,int32 whence)

{
  int32 whence_local;
  int32 offset_local;
  StreamMemory *this_local;
  
  if (whence == 0) {
    this->position = offset;
  }
  else if (whence == 1) {
    this->position = offset + this->position;
  }
  else {
    this->position = this->length - offset;
  }
  if (this->length < this->position) {
    if (this->capacity < this->position) {
      this->position = 0xffffffff;
    }
    else {
      this->length = this->position;
    }
  }
  return;
}

Assistant:

void
StreamMemory::seek(int32 offset, int32 whence)
{
	if(whence == 0)
		this->position = offset;
	else if(whence == 1)
		this->position += offset;
	else
		this->position = this->length-offset;
	if(this->position > this->length){
		// TODO: ideally this would depend on the mode
		if(this->position > this->capacity)
			this->position = S_EOF;
		else
			this->length = this->position;
	}
}